

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O1

bool __thiscall ON_Quaternion::GetRotation(ON_Quaternion *this,double *angle,ON_3dVector *axis)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = Length(this);
  dVar3 = 0.0;
  if (2.2250738585072014e-308 < dVar2) {
    dVar3 = acos(this->a / dVar2);
    dVar3 = dVar3 + dVar3;
  }
  *angle = dVar3;
  axis->x = this->b;
  axis->y = this->c;
  axis->z = this->d;
  bVar1 = ON_3dVector::Unitize(axis);
  return bVar1 && 2.2250738585072014e-308 < dVar2;
}

Assistant:

bool ON_Quaternion::GetRotation(double& angle, ON_3dVector& axis) const
{
  const double s = Length();
  angle = (s > ON_DBL_MIN) ? 2.0*acos(a/s) : 0.0;
  axis.x = b;
  axis.y = c;
  axis.z = d;
  return (axis.Unitize() && s > ON_DBL_MIN);
}